

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall embree::SceneGraph::GroupNode::GroupNode(GroupNode *this,size_t N)

{
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_RSI;
  Node *in_RDI;
  bool in_stack_ffffffffffffffcf;
  size_type in_stack_ffffffffffffffe8;
  
  Node::Node(in_RDI,in_stack_ffffffffffffffcf);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__GroupNode_005ff190;
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::vector((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            *)0x161a90);
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::resize(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

GroupNode (const size_t N = 0) { 
        children.resize(N); 
      }